

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O0

void __thiscall addrman_tests::addrman_select::test_method(addrman_select *this)

{
  long lVar1;
  initializer_list<CAddress> __l;
  initializer_list<CAddress> __l_00;
  initializer_list<CAddress> __l_01;
  initializer_list<CAddress> __l_02;
  initializer_list<CAddress> __l_03;
  initializer_list<CAddress> __l_04;
  initializer_list<CAddress> __l_05;
  bool bVar2;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffe158;
  direct_or_indirect *in_stack_ffffffffffffe160;
  CService *in_stack_ffffffffffffe168;
  _Optional_payload_base<bool> _Var3;
  CService *in_stack_ffffffffffffe170;
  _Optional_payload_base<Network> in_stack_ffffffffffffe178;
  undefined7 in_stack_ffffffffffffe180;
  undefined1 in_stack_ffffffffffffe187;
  CAddress *in_stack_ffffffffffffe188;
  const_string *in_stack_ffffffffffffe190;
  const_string *file;
  NodeContext *in_stack_ffffffffffffe198;
  iterator in_stack_ffffffffffffe1a0;
  string *in_stack_ffffffffffffe1a8;
  string *in_stack_ffffffffffffe1b0;
  uint16_t in_stack_ffffffffffffe246;
  undefined1 *local_1cb8;
  undefined1 *local_1c30;
  undefined1 *local_1bb0;
  undefined1 *local_1b48;
  undefined1 *local_1af0;
  undefined1 *local_1a60;
  undefined1 *local_18a0;
  int i;
  addrman_select *this_local;
  direct_or_indirect local_1684;
  undefined1 local_1668 [64];
  undefined8 local_1628;
  undefined8 uStack_1620;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  uint16_t local_15ea;
  undefined1 local_15e8 [8];
  undefined8 local_15e0;
  undefined1 local_15d8 [16];
  undefined1 local_15c8 [64];
  const_string local_1588 [2];
  lazy_ostream local_1568 [2];
  assertion_result local_1548 [2];
  const_string local_1510 [2];
  lazy_ostream local_14f0 [2];
  allocator<char> local_14ca [26];
  assertion_result local_14b0 [2];
  const_string local_1478 [2];
  lazy_ostream local_1458 [2];
  assertion_result local_1438 [2];
  const_string local_1400 [2];
  lazy_ostream local_13e0 [4];
  assertion_result local_13a0 [2];
  const_string local_1368 [2];
  lazy_ostream local_1348 [2];
  assertion_result local_1328 [2];
  const_string local_12f0 [2];
  lazy_ostream local_12d0 [4];
  assertion_result local_1290 [2];
  allocator<char> local_1253;
  allocator<char> local_1252;
  allocator<char> local_1251;
  const_string local_1250 [2];
  lazy_ostream local_1230 [2];
  allocator<char> local_120a [26];
  assertion_result local_11f0 [2];
  const_string local_11b8 [2];
  lazy_ostream local_1198 [4];
  assertion_result local_1158 [2];
  allocator<char> local_111a;
  allocator<char> local_1119;
  const_string local_1118 [2];
  lazy_ostream local_10f8 [2];
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  assertion_result local_10a0 [2];
  const_string local_1068 [2];
  lazy_ostream local_1048 [4];
  assertion_result local_1008 [2];
  allocator<char> local_fc9;
  undefined1 local_fc8 [8];
  undefined8 local_fc0;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [64];
  const_string local_f68 [2];
  lazy_ostream local_f48 [2];
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  assertion_result local_ef0 [2];
  const_string local_eb8 [2];
  lazy_ostream local_e98 [2];
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  assertion_result local_e38 [2];
  undefined1 local_e00 [8];
  undefined8 local_df8;
  undefined1 local_df0 [16];
  undefined1 local_de0 [64];
  const_string local_da0 [2];
  lazy_ostream local_d80 [2];
  assertion_result local_d60 [2];
  const_string local_d28 [2];
  lazy_ostream local_d08 [2];
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  assertion_result local_cb0 [2];
  const_string local_c78 [2];
  lazy_ostream local_c58 [2];
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  assertion_result local_c00 [2];
  undefined1 local_bc8 [8];
  undefined8 local_bc0;
  undefined1 local_bb8 [16];
  undefined1 local_ba8 [64];
  const_string local_b68 [2];
  lazy_ostream local_b48 [4];
  assertion_result local_b08 [2];
  allocator<char> local_aca;
  allocator<char> local_ac9;
  const_string local_ac8 [2];
  lazy_ostream local_aa8 [2];
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  assertion_result local_a50 [2];
  const_string local_a18 [2];
  lazy_ostream local_9f8 [2];
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  assertion_result local_998 [2];
  int32_t local_95c;
  __single_object addrman;
  optional<Network> local_940;
  optional<Network> local_938;
  optional<Network> local_930;
  optional<Network> local_928 [9];
  set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> ports;
  undefined1 local_7e0 [56];
  undefined1 local_7a8 [136];
  undefined1 local_720 [56];
  undefined1 local_6e8 [136];
  undefined1 local_660 [56];
  undefined1 local_628 [32];
  CService addr7;
  CService addr6;
  CService addr5;
  undefined1 local_4e0 [56];
  undefined1 local_4a8 [40];
  undefined1 local_480 [56];
  undefined1 local_448 [32];
  CService addr4;
  CService addr3;
  undefined1 local_350 [56];
  undefined1 local_318 [32];
  CService addr2;
  undefined1 local_148 [56];
  undefined1 local_110 [32];
  CService addr1;
  CNetAddr source;
  
  local_1008[0].m_message.px = (element_type *)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_95c = GetCheckRatio(in_stack_ffffffffffffe198);
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)in_stack_ffffffffffffe190,(bool *)in_stack_ffffffffffffe188,
             (int *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,
               (size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    local_9b8 = 0;
    uStack_9b0 = 0;
    local_9c8 = 0;
    uStack_9c0 = 0;
    local_9d8 = 0;
    uStack_9d0 = 0;
    local_9a8 = 0;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffe158);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffe170,
                    SUB81((ulong)in_stack_ffffffffffffe168 >> 0x38,0),
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)&in_stack_ffffffffffffe160->indirect_contents);
    CNetAddr::IsValid(&in_stack_ffffffffffffe170->super_CNetAddr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe168,
               SUB81((ulong)in_stack_ffffffffffffe160 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    in_stack_ffffffffffffe158 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_998,local_9f8,local_a18,0x8c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe158);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe158);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
             *)in_stack_ffffffffffffe158);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_ffffffffffffe158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,
               (size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    local_a68 = 0;
    uStack_a60 = 0;
    local_a78 = 0;
    uStack_a70 = 0;
    local_a88 = 0;
    uStack_a80 = 0;
    local_a58 = 0;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffe158);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffe170,
                    SUB81((ulong)in_stack_ffffffffffffe168 >> 0x38,0),
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)&in_stack_ffffffffffffe160->indirect_contents);
    CNetAddr::IsValid(&in_stack_ffffffffffffe170->super_CNetAddr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe168,
               SUB81((ulong)in_stack_ffffffffffffe160 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    in_stack_ffffffffffffe158 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a50,local_aa8,local_ac8,0x8d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe158);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe158);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
             *)in_stack_ffffffffffffe158);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_ffffffffffffe158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe1a8,(char *)in_stack_ffffffffffffe1a0,
             (allocator<char> *)in_stack_ffffffffffffe198);
  ResolveIP(in_stack_ffffffffffffe1b0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe158);
  std::allocator<char>::~allocator(&local_ac9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe1a8,(char *)in_stack_ffffffffffffe1a0,
             (allocator<char> *)in_stack_ffffffffffffe198);
  ResolveService(in_stack_ffffffffffffe1a8,in_stack_ffffffffffffe246);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe158);
  std::allocator<char>::~allocator(&local_aca);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,
               (size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    CService::CService(in_stack_ffffffffffffe168,
                       (CService *)&in_stack_ffffffffffffe160->indirect_contents);
    CAddress::CAddress(in_stack_ffffffffffffe188,
                       (CService *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180),
                       (ServiceFlags)in_stack_ffffffffffffe178);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_ffffffffffffe158);
    __l._M_len = (size_type)in_stack_ffffffffffffe1a8;
    __l._M_array = in_stack_ffffffffffffe1a0;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffe198,__l,
               (allocator_type *)in_stack_ffffffffffffe190);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_ffffffffffffe168,
                 (vector<CAddress,_std::allocator<CAddress>_> *)
                 &in_stack_ffffffffffffe160->indirect_contents,(CNetAddr *)in_stack_ffffffffffffe158
                 ,(seconds)in_stack_ffffffffffffe178);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe168,
               SUB81((ulong)in_stack_ffffffffffffe160 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    in_stack_ffffffffffffe158 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b08,local_b48,local_b68,0x93,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe158);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe158);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffe168);
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_ffffffffffffe158);
    local_18a0 = local_110;
    do {
      local_18a0 = local_18a0 + -0x38;
      CAddress::~CAddress((CAddress *)in_stack_ffffffffffffe158);
    } while (local_18a0 != local_148);
    CService::~CService((CService *)in_stack_ffffffffffffe158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,
               (size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    _Var3 = SUB82((ulong)in_stack_ffffffffffffe168 >> 0x30,0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    std::optional<Network>::optional(local_928);
    std::optional<bool>::optional((optional<bool> *)(local_bc8 + 6));
    local_bc0 = AddrMan::Size((AddrMan *)&in_stack_ffffffffffffe160->indirect_contents,
                              (optional<Network>)in_stack_ffffffffffffe178,(optional<bool>)_Var3);
    local_bc8._0_4_ = 1;
    in_stack_ffffffffffffe168 = (CService *)0x1bc11bb;
    in_stack_ffffffffffffe160 = (direct_or_indirect *)local_bc8;
    in_stack_ffffffffffffe158 = "addrman->Size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_ba8,local_bb8,0x94,1,2,&local_bc0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,
               (size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    local_c18 = 0;
    uStack_c10 = 0;
    local_c28 = 0;
    uStack_c20 = 0;
    local_c38 = 0;
    uStack_c30 = 0;
    local_c08 = 0;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffe158);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffe170,
                    SUB81((ulong)in_stack_ffffffffffffe168 >> 0x38,0),
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)&in_stack_ffffffffffffe160->indirect_contents);
    ::operator==((CService *)in_stack_ffffffffffffe178,in_stack_ffffffffffffe170);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe168,
               SUB81((ulong)in_stack_ffffffffffffe160 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    in_stack_ffffffffffffe158 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c00,local_c58,local_c78,0x96,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe158);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe158);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
             *)in_stack_ffffffffffffe158);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_ffffffffffffe158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,
               (size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    local_cc8 = 0;
    uStack_cc0 = 0;
    local_cd8 = 0;
    uStack_cd0 = 0;
    local_ce8 = 0;
    uStack_ce0 = 0;
    local_cb8 = 0;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffe158);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffe170,
                    SUB81((ulong)in_stack_ffffffffffffe168 >> 0x38,0),
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)&in_stack_ffffffffffffe160->indirect_contents);
    ::operator==((CService *)in_stack_ffffffffffffe178,in_stack_ffffffffffffe170);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe168,
               SUB81((ulong)in_stack_ffffffffffffe160 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    in_stack_ffffffffffffe158 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_cb0,local_d08,local_d28,0x97,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe158);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe158);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
             *)in_stack_ffffffffffffe158);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_ffffffffffffe158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,
               (size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    CService::CService(in_stack_ffffffffffffe168,
                       (CService *)&in_stack_ffffffffffffe160->indirect_contents);
    CAddress::CAddress(in_stack_ffffffffffffe188,
                       (CService *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180),
                       (ServiceFlags)in_stack_ffffffffffffe178);
    Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    AddrMan::Good((AddrMan *)in_stack_ffffffffffffe168,
                  (CService *)&in_stack_ffffffffffffe160->indirect_contents,
                  (NodeSeconds)in_stack_ffffffffffffe178);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe168,
               SUB81((ulong)in_stack_ffffffffffffe160 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    in_stack_ffffffffffffe158 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d60,local_d80,local_da0,0x9a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe158);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe158);
    CAddress::~CAddress((CAddress *)in_stack_ffffffffffffe158);
    CService::~CService((CService *)in_stack_ffffffffffffe158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,
               (size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    _Var3 = SUB82((ulong)in_stack_ffffffffffffe168 >> 0x30,0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    std::optional<Network>::optional(&local_930);
    std::optional<bool>::optional((optional<bool> *)(local_e00 + 6));
    local_df8 = AddrMan::Size((AddrMan *)&in_stack_ffffffffffffe160->indirect_contents,
                              (optional<Network>)in_stack_ffffffffffffe178,(optional<bool>)_Var3);
    local_e00._0_4_ = 1;
    in_stack_ffffffffffffe168 = (CService *)0x1bc11bb;
    in_stack_ffffffffffffe160 = (direct_or_indirect *)local_e00;
    in_stack_ffffffffffffe158 = "addrman->Size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_de0,local_df0,0x9c,1,2,&local_df8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,
               (size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    local_e58 = 0;
    uStack_e50 = 0;
    local_e68 = 0;
    uStack_e60 = 0;
    local_e78 = 0;
    uStack_e70 = 0;
    local_e48 = 0;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffe158);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffe170,
                    SUB81((ulong)in_stack_ffffffffffffe168 >> 0x38,0),
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)&in_stack_ffffffffffffe160->indirect_contents);
    CNetAddr::IsValid(&in_stack_ffffffffffffe170->super_CNetAddr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe168,
               SUB81((ulong)in_stack_ffffffffffffe160 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    in_stack_ffffffffffffe158 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e38,local_e98,local_eb8,0x9d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe158);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe158);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
             *)in_stack_ffffffffffffe158);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_ffffffffffffe158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,
               (size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    local_f08 = 0;
    uStack_f00 = 0;
    local_f18 = 0;
    uStack_f10 = 0;
    local_f28 = 0;
    uStack_f20 = 0;
    local_ef8 = 0;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffe158);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffe170,
                    SUB81((ulong)in_stack_ffffffffffffe168 >> 0x38,0),
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)&in_stack_ffffffffffffe160->indirect_contents);
    ::operator==((CService *)in_stack_ffffffffffffe178,in_stack_ffffffffffffe170);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe168,
               SUB81((ulong)in_stack_ffffffffffffe160 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    in_stack_ffffffffffffe158 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ef0,local_f48,local_f68,0x9e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe158);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe158);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
             *)in_stack_ffffffffffffe158);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_ffffffffffffe158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,
               (size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    _Var3 = SUB82((ulong)in_stack_ffffffffffffe168 >> 0x30,0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    std::optional<Network>::optional(&local_938);
    std::optional<bool>::optional((optional<bool> *)(local_fc8 + 6));
    local_fc0 = AddrMan::Size((AddrMan *)&in_stack_ffffffffffffe160->indirect_contents,
                              (optional<Network>)in_stack_ffffffffffffe178,(optional<bool>)_Var3);
    local_fc8._0_4_ = 1;
    in_stack_ffffffffffffe168 = (CService *)0x1bc11bb;
    in_stack_ffffffffffffe160 = (direct_or_indirect *)local_fc8;
    in_stack_ffffffffffffe158 = "addrman->Size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_fa8,local_fb8,0x9f,1,2,&local_fc0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe1a8,(char *)in_stack_ffffffffffffe1a0,
             (allocator<char> *)in_stack_ffffffffffffe198);
  ResolveService(in_stack_ffffffffffffe1a8,in_stack_ffffffffffffe246);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe158);
  std::allocator<char>::~allocator(&local_fc9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,
               (size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    CService::CService(in_stack_ffffffffffffe168,
                       (CService *)&in_stack_ffffffffffffe160->indirect_contents);
    CAddress::CAddress(in_stack_ffffffffffffe188,
                       (CService *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180),
                       (ServiceFlags)in_stack_ffffffffffffe178);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_ffffffffffffe158);
    __l_00._M_len = (size_type)in_stack_ffffffffffffe1a8;
    __l_00._M_array = in_stack_ffffffffffffe1a0;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffe198,__l_00,
               (allocator_type *)in_stack_ffffffffffffe190);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_ffffffffffffe168,
                 (vector<CAddress,_std::allocator<CAddress>_> *)
                 &in_stack_ffffffffffffe160->indirect_contents,(CNetAddr *)in_stack_ffffffffffffe158
                 ,(seconds)in_stack_ffffffffffffe178);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe168,
               SUB81((ulong)in_stack_ffffffffffffe160 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    in_stack_ffffffffffffe158 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1008,local_1048,local_1068,0xa3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe158);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe158);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffe168);
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_ffffffffffffe158);
    local_1a60 = local_318;
    do {
      local_1a60 = local_1a60 + -0x38;
      CAddress::~CAddress((CAddress *)in_stack_ffffffffffffe158);
    } while (local_1a60 != local_350);
    CService::~CService((CService *)in_stack_ffffffffffffe158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,
               (size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    local_10b8 = 0;
    uStack_10b0 = 0;
    local_10c8 = 0;
    uStack_10c0 = 0;
    local_10d8 = 0;
    uStack_10d0 = 0;
    local_10a8 = 0;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffe158);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffe170,
                    SUB81((ulong)in_stack_ffffffffffffe168 >> 0x38,0),
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)&in_stack_ffffffffffffe160->indirect_contents);
    ::operator==((CService *)in_stack_ffffffffffffe178,in_stack_ffffffffffffe170);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe168,
               SUB81((ulong)in_stack_ffffffffffffe160 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    in_stack_ffffffffffffe158 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_10a0,local_10f8,local_1118,0xa4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe158);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe158);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
             *)in_stack_ffffffffffffe158);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_ffffffffffffe158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe1a8,(char *)in_stack_ffffffffffffe1a0,
             (allocator<char> *)in_stack_ffffffffffffe198);
  ResolveService(in_stack_ffffffffffffe1a8,in_stack_ffffffffffffe246);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe158);
  std::allocator<char>::~allocator(&local_1119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe1a8,(char *)in_stack_ffffffffffffe1a0,
             (allocator<char> *)in_stack_ffffffffffffe198);
  ResolveService(in_stack_ffffffffffffe1a8,in_stack_ffffffffffffe246);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe158);
  std::allocator<char>::~allocator(&local_111a);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,
               (size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    CService::CService(in_stack_ffffffffffffe168,
                       (CService *)&in_stack_ffffffffffffe160->indirect_contents);
    CAddress::CAddress(in_stack_ffffffffffffe188,
                       (CService *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180),
                       (ServiceFlags)in_stack_ffffffffffffe178);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_ffffffffffffe158);
    __l_01._M_len = (size_type)in_stack_ffffffffffffe1a8;
    __l_01._M_array = in_stack_ffffffffffffe1a0;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffe198,__l_01,
               (allocator_type *)in_stack_ffffffffffffe190);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_ffffffffffffe168,
                 (vector<CAddress,_std::allocator<CAddress>_> *)
                 &in_stack_ffffffffffffe160->indirect_contents,(CNetAddr *)in_stack_ffffffffffffe158
                 ,(seconds)in_stack_ffffffffffffe178);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe168,
               SUB81((ulong)in_stack_ffffffffffffe160 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    in_stack_ffffffffffffe158 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1158,local_1198,local_11b8,0xaa,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe158);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe158);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffe168);
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_ffffffffffffe158);
    local_1af0 = local_448;
    do {
      local_1af0 = local_1af0 + -0x38;
      CAddress::~CAddress((CAddress *)in_stack_ffffffffffffe158);
    } while (local_1af0 != local_480);
    CService::~CService((CService *)in_stack_ffffffffffffe158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,
               (size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    CService::CService(in_stack_ffffffffffffe168,
                       (CService *)&in_stack_ffffffffffffe160->indirect_contents);
    CAddress::CAddress(in_stack_ffffffffffffe188,
                       (CService *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180),
                       (ServiceFlags)in_stack_ffffffffffffe178);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_ffffffffffffe158);
    __l_02._M_len = (size_type)in_stack_ffffffffffffe1a8;
    __l_02._M_array = in_stack_ffffffffffffe1a0;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffe198,__l_02,
               (allocator_type *)in_stack_ffffffffffffe190);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe1a8,(char *)in_stack_ffffffffffffe1a0,
               (allocator<char> *)in_stack_ffffffffffffe198);
    ResolveService(in_stack_ffffffffffffe1a8,in_stack_ffffffffffffe246);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_ffffffffffffe168,
                 (vector<CAddress,_std::allocator<CAddress>_> *)
                 &in_stack_ffffffffffffe160->indirect_contents,(CNetAddr *)in_stack_ffffffffffffe158
                 ,(seconds)in_stack_ffffffffffffe178);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe168,
               SUB81((ulong)in_stack_ffffffffffffe160 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    in_stack_ffffffffffffe158 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_11f0,local_1230,local_1250,0xab,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe158);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe158);
    CService::~CService((CService *)in_stack_ffffffffffffe158);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe158);
    std::allocator<char>::~allocator(local_120a);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffe168);
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_ffffffffffffe158);
    local_1b48 = local_4a8;
    do {
      local_1b48 = local_1b48 + -0x38;
      CAddress::~CAddress((CAddress *)in_stack_ffffffffffffe158);
    } while (local_1b48 != local_4e0);
    CService::~CService((CService *)in_stack_ffffffffffffe158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe1a8,(char *)in_stack_ffffffffffffe1a0,
             (allocator<char> *)in_stack_ffffffffffffe198);
  ResolveService(in_stack_ffffffffffffe1a8,in_stack_ffffffffffffe246);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe158);
  std::allocator<char>::~allocator(&local_1251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe1a8,(char *)in_stack_ffffffffffffe1a0,
             (allocator<char> *)in_stack_ffffffffffffe198);
  ResolveService(in_stack_ffffffffffffe1a8,in_stack_ffffffffffffe246);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe158);
  std::allocator<char>::~allocator(&local_1252);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe1a8,(char *)in_stack_ffffffffffffe1a0,
             (allocator<char> *)in_stack_ffffffffffffe198);
  ResolveService(in_stack_ffffffffffffe1a8,in_stack_ffffffffffffe246);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe158);
  std::allocator<char>::~allocator(&local_1253);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,
               (size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    CService::CService(in_stack_ffffffffffffe168,
                       (CService *)&in_stack_ffffffffffffe160->indirect_contents);
    CAddress::CAddress(in_stack_ffffffffffffe188,
                       (CService *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180),
                       (ServiceFlags)in_stack_ffffffffffffe178);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_ffffffffffffe158);
    __l_03._M_len = (size_type)in_stack_ffffffffffffe1a8;
    __l_03._M_array = in_stack_ffffffffffffe1a0;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffe198,__l_03,
               (allocator_type *)in_stack_ffffffffffffe190);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_ffffffffffffe168,
                 (vector<CAddress,_std::allocator<CAddress>_> *)
                 &in_stack_ffffffffffffe160->indirect_contents,(CNetAddr *)in_stack_ffffffffffffe158
                 ,(seconds)in_stack_ffffffffffffe178);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe168,
               SUB81((ulong)in_stack_ffffffffffffe160 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    in_stack_ffffffffffffe158 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1290,local_12d0,local_12f0,0xb2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe158);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe158);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffe168);
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_ffffffffffffe158);
    local_1bb0 = local_628;
    do {
      local_1bb0 = local_1bb0 + -0x38;
      CAddress::~CAddress((CAddress *)in_stack_ffffffffffffe158);
    } while (local_1bb0 != local_660);
    CService::~CService((CService *)in_stack_ffffffffffffe158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,
               (size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    CService::CService(in_stack_ffffffffffffe168,
                       (CService *)&in_stack_ffffffffffffe160->indirect_contents);
    CAddress::CAddress(in_stack_ffffffffffffe188,
                       (CService *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180),
                       (ServiceFlags)in_stack_ffffffffffffe178);
    Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    AddrMan::Good((AddrMan *)in_stack_ffffffffffffe168,
                  (CService *)&in_stack_ffffffffffffe160->indirect_contents,
                  (NodeSeconds)in_stack_ffffffffffffe178);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe168,
               SUB81((ulong)in_stack_ffffffffffffe160 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    in_stack_ffffffffffffe158 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1328,local_1348,local_1368,0xb3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe158);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe158);
    CAddress::~CAddress((CAddress *)in_stack_ffffffffffffe158);
    CService::~CService((CService *)in_stack_ffffffffffffe158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,
               (size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    CService::CService(in_stack_ffffffffffffe168,
                       (CService *)&in_stack_ffffffffffffe160->indirect_contents);
    CAddress::CAddress(in_stack_ffffffffffffe188,
                       (CService *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180),
                       (ServiceFlags)in_stack_ffffffffffffe178);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_ffffffffffffe158);
    __l_04._M_len = (size_type)in_stack_ffffffffffffe1a8;
    __l_04._M_array = in_stack_ffffffffffffe1a0;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffe198,__l_04,
               (allocator_type *)in_stack_ffffffffffffe190);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_ffffffffffffe168,
                 (vector<CAddress,_std::allocator<CAddress>_> *)
                 &in_stack_ffffffffffffe160->indirect_contents,(CNetAddr *)in_stack_ffffffffffffe158
                 ,(seconds)in_stack_ffffffffffffe178);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe168,
               SUB81((ulong)in_stack_ffffffffffffe160 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    in_stack_ffffffffffffe158 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_13a0,local_13e0,local_1400,0xb4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe158);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe158);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffe168);
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_ffffffffffffe158);
    local_1c30 = local_6e8;
    do {
      local_1c30 = local_1c30 + -0x38;
      CAddress::~CAddress((CAddress *)in_stack_ffffffffffffe158);
    } while (local_1c30 != local_720);
    CService::~CService((CService *)in_stack_ffffffffffffe158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,
               (size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    CService::CService(in_stack_ffffffffffffe168,
                       (CService *)&in_stack_ffffffffffffe160->indirect_contents);
    CAddress::CAddress(in_stack_ffffffffffffe188,
                       (CService *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180),
                       (ServiceFlags)in_stack_ffffffffffffe178);
    Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    AddrMan::Good((AddrMan *)in_stack_ffffffffffffe168,
                  (CService *)&in_stack_ffffffffffffe160->indirect_contents,
                  (NodeSeconds)in_stack_ffffffffffffe178);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe168,
               SUB81((ulong)in_stack_ffffffffffffe160 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    in_stack_ffffffffffffe158 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1438,local_1458,local_1478,0xb5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe158);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe158);
    CAddress::~CAddress((CAddress *)in_stack_ffffffffffffe158);
    CService::~CService((CService *)in_stack_ffffffffffffe158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,
               (size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    CService::CService(in_stack_ffffffffffffe168,
                       (CService *)&in_stack_ffffffffffffe160->indirect_contents);
    CAddress::CAddress(in_stack_ffffffffffffe188,
                       (CService *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180),
                       (ServiceFlags)in_stack_ffffffffffffe178);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_ffffffffffffe158);
    __l_05._M_len = (size_type)in_stack_ffffffffffffe1a8;
    __l_05._M_array = in_stack_ffffffffffffe1a0;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffe198,__l_05,
               (allocator_type *)in_stack_ffffffffffffe190);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe1a8,(char *)in_stack_ffffffffffffe1a0,
               (allocator<char> *)in_stack_ffffffffffffe198);
    ResolveService(in_stack_ffffffffffffe1a8,in_stack_ffffffffffffe246);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_ffffffffffffe168,
                 (vector<CAddress,_std::allocator<CAddress>_> *)
                 &in_stack_ffffffffffffe160->indirect_contents,(CNetAddr *)in_stack_ffffffffffffe158
                 ,(seconds)in_stack_ffffffffffffe178);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe168,
               SUB81((ulong)in_stack_ffffffffffffe160 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    in_stack_ffffffffffffe158 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_14b0,local_14f0,local_1510,0xb6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe158);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe158);
    CService::~CService((CService *)in_stack_ffffffffffffe158);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe158);
    std::allocator<char>::~allocator(local_14ca);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffe168);
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_ffffffffffffe158);
    local_1cb8 = local_7a8;
    do {
      local_1cb8 = local_1cb8 + -0x38;
      CAddress::~CAddress((CAddress *)in_stack_ffffffffffffe158);
    } while (local_1cb8 != local_7e0);
    CService::~CService((CService *)in_stack_ffffffffffffe158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,
               (size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    CService::CService(in_stack_ffffffffffffe168,
                       (CService *)&in_stack_ffffffffffffe160->indirect_contents);
    CAddress::CAddress(in_stack_ffffffffffffe188,
                       (CService *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180),
                       (ServiceFlags)in_stack_ffffffffffffe178);
    Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    AddrMan::Good((AddrMan *)in_stack_ffffffffffffe168,
                  (CService *)&in_stack_ffffffffffffe160->indirect_contents,
                  (NodeSeconds)in_stack_ffffffffffffe178);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe168,
               SUB81((ulong)in_stack_ffffffffffffe160 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    in_stack_ffffffffffffe158 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1548,local_1568,local_1588,0xb7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe158);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe158);
    CAddress::~CAddress((CAddress *)in_stack_ffffffffffffe158);
    CService::~CService((CService *)in_stack_ffffffffffffe158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,
               (size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    _Var3 = SUB82((ulong)in_stack_ffffffffffffe168 >> 0x30,0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    std::optional<Network>::optional(&local_940);
    std::optional<bool>::optional((optional<bool> *)(local_15e8 + 6));
    local_15e0 = AddrMan::Size((AddrMan *)&in_stack_ffffffffffffe160->indirect_contents,
                               (optional<Network>)in_stack_ffffffffffffe178,(optional<bool>)_Var3);
    local_15e8._0_4_ = 7;
    in_stack_ffffffffffffe168 = (CService *)0x1bf41b2;
    in_stack_ffffffffffffe160 = (direct_or_indirect *)local_15e8;
    in_stack_ffffffffffffe158 = "addrman->Size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_15c8,local_15d8,0xba,1,2,&local_15e0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::set
            ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
             in_stack_ffffffffffffe158);
  for (i = 0; i < 0x14; i = i + 1) {
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe158);
    local_1608 = 0;
    uStack_1600 = 0;
    local_1618 = 0;
    uStack_1610 = 0;
    local_1628 = 0;
    uStack_1620 = 0;
    local_15f8 = 0;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffe158);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffe170,
                    SUB81((ulong)in_stack_ffffffffffffe168 >> 0x38,0),
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)&in_stack_ffffffffffffe160->indirect_contents);
    local_15ea = CService::GetPort((CService *)in_stack_ffffffffffffe158);
    std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::insert
              ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
               in_stack_ffffffffffffe168,(value_type_conflict4 *)in_stack_ffffffffffffe160->direct);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
             *)in_stack_ffffffffffffe158);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_ffffffffffffe158);
  }
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe158);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe198,file,(size_t)in_stack_ffffffffffffe188,
               (const_string *)CONCAT17(in_stack_ffffffffffffe187,in_stack_ffffffffffffe180));
    in_stack_ffffffffffffe188 = (CAddress *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffe160->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffe158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160->direct,(unsigned_long)in_stack_ffffffffffffe158);
    local_1684._4_8_ =
         std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::size
                   ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
                     *)in_stack_ffffffffffffe158);
    local_1684._0_4_ = 3;
    in_stack_ffffffffffffe168 = (CService *)0x1c9d877;
    in_stack_ffffffffffffe160 = &local_1684;
    in_stack_ffffffffffffe158 = "ports.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_1668,local_1684.direct + 0xc,0xc1,1,2,local_1684.direct + 4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe158);
    in_stack_ffffffffffffe187 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffe187);
  std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::~set
            ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
             in_stack_ffffffffffffe158);
  CService::~CService((CService *)in_stack_ffffffffffffe158);
  CService::~CService((CService *)in_stack_ffffffffffffe158);
  CService::~CService((CService *)in_stack_ffffffffffffe158);
  CService::~CService((CService *)in_stack_ffffffffffffe158);
  CService::~CService((CService *)in_stack_ffffffffffffe158);
  CService::~CService((CService *)in_stack_ffffffffffffe158);
  CService::~CService((CService *)in_stack_ffffffffffffe158);
  CNetAddr::~CNetAddr((CNetAddr *)in_stack_ffffffffffffe158);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffe168);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_select)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    BOOST_CHECK(!addrman->Select(false).first.IsValid());
    BOOST_CHECK(!addrman->Select(true).first.IsValid());

    CNetAddr source = ResolveIP("252.2.2.2");

    // Add 1 address to the new table
    CService addr1 = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr1, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);

    BOOST_CHECK(addrman->Select(/*new_only=*/true).first == addr1);
    BOOST_CHECK(addrman->Select(/*new_only=*/false).first == addr1);

    // Move address to the tried table
    BOOST_CHECK(addrman->Good(CAddress(addr1, NODE_NONE)));

    BOOST_CHECK_EQUAL(addrman->Size(), 1U);
    BOOST_CHECK(!addrman->Select(/*new_only=*/true).first.IsValid());
    BOOST_CHECK(addrman->Select().first == addr1);
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);

    // Add one address to the new table
    CService addr2 = ResolveService("250.3.1.1", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr2, NODE_NONE)}, addr2));
    BOOST_CHECK(addrman->Select(/*new_only=*/true).first == addr2);

    // Add two more addresses to the new table
    CService addr3 = ResolveService("250.3.2.2", 9999);
    CService addr4 = ResolveService("250.3.3.3", 9999);

    BOOST_CHECK(addrman->Add({CAddress(addr3, NODE_NONE)}, addr2));
    BOOST_CHECK(addrman->Add({CAddress(addr4, NODE_NONE)}, ResolveService("250.4.1.1", 8333)));

    // Add three addresses to tried table.
    CService addr5 = ResolveService("250.4.4.4", 8333);
    CService addr6 = ResolveService("250.4.5.5", 7777);
    CService addr7 = ResolveService("250.4.6.6", 8333);

    BOOST_CHECK(addrman->Add({CAddress(addr5, NODE_NONE)}, addr3));
    BOOST_CHECK(addrman->Good(CAddress(addr5, NODE_NONE)));
    BOOST_CHECK(addrman->Add({CAddress(addr6, NODE_NONE)}, addr3));
    BOOST_CHECK(addrman->Good(CAddress(addr6, NODE_NONE)));
    BOOST_CHECK(addrman->Add({CAddress(addr7, NODE_NONE)}, ResolveService("250.1.1.3", 8333)));
    BOOST_CHECK(addrman->Good(CAddress(addr7, NODE_NONE)));

    // 6 addrs + 1 addr from last test = 7.
    BOOST_CHECK_EQUAL(addrman->Size(), 7U);

    // Select pulls from new and tried regardless of port number.
    std::set<uint16_t> ports;
    for (int i = 0; i < 20; ++i) {
        ports.insert(addrman->Select().first.GetPort());
    }
    BOOST_CHECK_EQUAL(ports.size(), 3U);
}